

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha512BytePubkey_Test::~HashUtil_Sha512BytePubkey_Test
          (HashUtil_Sha512BytePubkey_Test *this)

{
  HashUtil_Sha512BytePubkey_Test *this_local;
  
  ~HashUtil_Sha512BytePubkey_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashUtil, Sha512BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData byte_data = HashUtil::Sha512(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "3f7a5ecb744920c058e56759f853698ab2cbb62fa511f2211cc50f72152967d5545e67e13bcc19aeb4e699e417ac0c878342e3775d36a8e0b4cd75b1bd924b68");
}